

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_get_active_map(AV1_COMP *cpi,uchar *new_map_16x16,int rows,int cols)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  long lVar4;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  uint8_t temp;
  int c;
  int r;
  int col_scale;
  int row_scale;
  int mi_cols;
  int mi_rows;
  uchar *seg_map_8x8;
  CommonModeInfoParams *mi_params;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_4;
  
  if (((in_EDX == *(int *)(in_RDI + 0x3c188)) && (in_ECX == *(int *)(in_RDI + 0x3c18c))) &&
     (in_RSI != (void *)0x0)) {
    lVar3 = *(long *)(in_RDI + 0x71298);
    iVar1 = *(int *)(in_RDI + 0x3c194);
    iVar2 = *(int *)(in_RDI + 0x3c198);
    memset(in_RSI,(uint)((*(int *)(in_RDI + 0x712b0) != 0 ^ 0xffU) & 1),(long)(in_EDX * in_ECX));
    if (*(int *)(in_RDI + 0x712b0) != 0) {
      for (local_44 = 0; local_44 < iVar1 >> 2; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < iVar2 >> 2; local_48 = local_48 + 1) {
          lVar4 = (long)(local_44 * in_ECX + local_48);
          *(byte *)((long)in_RSI + lVar4) =
               *(byte *)((long)in_RSI + lVar4) |
               (((*(char *)(lVar3 + (local_44 * 2 * iVar2 + local_48 * 2)) != '\a' ||
                 *(char *)(lVar3 + (local_44 * 2 * iVar2 + local_48 * 2 + 1)) != '\a') ||
                *(char *)(lVar3 + ((local_44 * 2 + 1) * iVar2 + local_48 * 2)) != '\a') ||
               *(char *)(lVar3 + ((local_44 * 2 + 1) * iVar2 + local_48 * 2 + 1)) != '\a');
        }
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int av1_get_active_map(AV1_COMP *cpi, unsigned char *new_map_16x16, int rows,
                       int cols) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  if (rows == mi_params->mb_rows && cols == mi_params->mb_cols &&
      new_map_16x16) {
    unsigned char *const seg_map_8x8 = cpi->enc_seg.map;
    const int mi_rows = mi_params->mi_rows;
    const int mi_cols = mi_params->mi_cols;
    const int row_scale = mi_size_high_log2[BLOCK_16X16];
    const int col_scale = mi_size_wide_log2[BLOCK_16X16];
    assert(mi_rows % 2 == 0);
    assert(mi_cols % 2 == 0);

    memset(new_map_16x16, !cpi->active_map.enabled, rows * cols);
    if (cpi->active_map.enabled) {
      for (int r = 0; r < (mi_rows >> row_scale); ++r) {
        for (int c = 0; c < (mi_cols >> col_scale); ++c) {
          // Cyclic refresh segments are considered active despite not having
          // AM_SEGMENT_ID_ACTIVE
          uint8_t temp = 0;
          temp |= seg_map_8x8[(2 * r + 0) * mi_cols + (2 * c + 0)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 0) * mi_cols + (2 * c + 1)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 1) * mi_cols + (2 * c + 0)] !=
                  AM_SEGMENT_ID_INACTIVE;
          temp |= seg_map_8x8[(2 * r + 1) * mi_cols + (2 * c + 1)] !=
                  AM_SEGMENT_ID_INACTIVE;
          new_map_16x16[r * cols + c] |= temp;
        }
      }
    }
    return 0;
  }

  return -1;
}